

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::prepareNextRound
          (OperatorPerformanceCase *this)

{
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  *this_00;
  int iVar1;
  TestLog *pTVar2;
  pointer pWVar3;
  State SVar4;
  InternalError *this_01;
  int iVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  pointer pfStack_1a0;
  pointer local_198;
  ios_base local_138 [264];
  
  do {
    pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    if ((this->m_state == STATE_CALIBRATING) &&
       (SVar4 = deqp::gls::TheilSenCalibrator::getState(&this->m_calibrator),
       SVar4 == STATE_FINISHED)) {
      this->m_state = STATE_FIND_HIGH_WORKLOAD;
      this->m_measureProgramNdx = 0;
    }
    if (this->m_state == STATE_FIND_HIGH_WORKLOAD) {
      this_00 = (this->m_workloadRecordsFindHigh).
                super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_measureProgramNdx;
      pWVar3 = (this_00->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if ((this_00->
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
          )._M_impl.super__Vector_impl_data._M_start == pWVar3) {
LAB_0139f85a:
        pWVar3 = (this_00->
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((this_00->
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
            )._M_impl.super__Vector_impl_data._M_start == pWVar3) {
          uVar6 = 1;
        }
        else {
          uVar6 = pWVar3[-1].workloadSize * 2;
          if (0x20000000 < (int)uVar6) {
            local_1b0 = (undefined1  [8])pTVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Even workload size ",0x13);
            std::ostream::operator<<
                      ((ostringstream *)&local_1a8,
                       (this_00->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                       )._M_impl.super__Vector_impl_data._M_finish[-1].workloadSize);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8," doesn\'t give high enough frame time for program ",
                       0x31);
            std::ostream::operator<<((ostringstream *)&local_1a8,this->m_measureProgramNdx);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,". Can\'t get sensible result.",0x1c);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
            std::ios_base::~ios_base(local_138);
            this_01 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (this_01,"Unable to get sensible measurements for estimation",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                       ,0x2ce);
            __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
          }
        }
        local_1b0._0_4_ = uVar6;
        local_1a8 = (_func_int **)0x0;
        pfStack_1a0 = (pointer)0x0;
        local_198 = (pointer)0x0;
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
        ::push_back(this_00,(value_type *)local_1b0);
        if (local_1a8 != (_func_int **)0x0) {
          operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
        }
        (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                  (this,(ulong)(((this->m_programs).
                                 super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr->m_program).
                               m_program,(ulong)uVar6);
        render(this,(this->m_calibrator).m_measureState.numDrawCalls);
        this->m_workloadMeasurementNdx = 0;
        return;
      }
      fVar8 = WorkloadRecord::getMedianTime(pWVar3 + -1);
      fVar9 = WorkloadRecord::getMedianTime
                        ((this_00->
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                         )._M_impl.super__Vector_impl_data._M_start);
      if (fVar8 < fVar9 + fVar9) goto LAB_0139f85a;
      (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[this->m_measureProgramNdx] =
           (this_00->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1].workloadSize;
      iVar7 = this->m_measureProgramNdx + 1;
      this->m_measureProgramNdx = iVar7;
      if ((int)((ulong)((long)(this->m_programs).
                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_programs).
                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) <= iVar7) {
        this->m_state = STATE_MEASURING;
        this->m_measureProgramNdx = 0;
        this->m_workloadNdx = -1;
      }
      iVar7 = this->m_measureProgramNdx;
    }
    else {
      if (this->m_state == STATE_CALIBRATING) {
        (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                  (this,(ulong)(((this->m_programs).
                                 super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ptr->m_program).
                               m_program,1);
        render(this,(this->m_calibrator).m_measureState.numDrawCalls);
        return;
      }
      iVar7 = this->m_numWorkloads;
      iVar5 = this->m_workloadNdx + 1;
      this->m_workloadNdx = iVar5;
      if (iVar5 < iVar7) {
        iVar1 = (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[this->m_measureProgramNdx];
        if (iVar7 < iVar1) {
          iVar5 = ((iVar1 + -1) * iVar5) / (iVar7 + -1);
        }
        (*(this->super_TestCase).super_TestNode._vptr_TestNode[7])
                  (this,(ulong)(((this->m_programs).
                                 super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [this->m_measureProgramNdx].m_ptr)->m_program).m_program,
                   (ulong)(iVar5 + 1U));
        render(this,(this->m_calibrator).m_measureState.numDrawCalls);
        this->m_workloadMeasurementNdx = 0;
        local_1b0._0_4_ = iVar5 + 1U;
        local_1a8 = (_func_int **)0x0;
        pfStack_1a0 = (pointer)0x0;
        local_198 = (pointer)0x0;
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
        ::push_back((this->m_workloadRecords).
                    super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->m_measureProgramNdx,
                    (value_type *)local_1b0);
        if (local_1a8 == (_func_int **)0x0) {
          return;
        }
        operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
        return;
      }
      iVar7 = this->m_measureProgramNdx + 1;
      this->m_measureProgramNdx = iVar7;
      if ((int)((ulong)((long)(this->m_programs).
                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_programs).
                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) <= iVar7) {
        this->m_state = STATE_REPORTING;
        return;
      }
      this->m_workloadNdx = -1;
      this->m_workloadMeasurementNdx = 0;
    }
    prepareProgram(this,iVar7);
  } while( true );
}

Assistant:

void OperatorPerformanceCase::prepareNextRound (void)
{
	DE_ASSERT(m_state == STATE_CALIBRATING			||
			  m_state == STATE_FIND_HIGH_WORKLOAD	||
			  m_state == STATE_MEASURING);

	TestLog& log = m_testCtx.getLog();

	if (m_state == STATE_CALIBRATING && m_calibrator.getState() == TheilSenCalibrator::STATE_FINISHED)
	{
		m_measureProgramNdx = 0;
		m_state = STATE_FIND_HIGH_WORKLOAD;
	}

	if (m_state == STATE_CALIBRATING)
		prepareWorkload(0, 1);
	else if (m_state == STATE_FIND_HIGH_WORKLOAD)
	{
		vector<WorkloadRecord>& records = m_workloadRecordsFindHigh[m_measureProgramNdx];

		if (records.empty() || records.back().getMedianTime() < 2.0f*records[0].getMedianTime())
		{
			int workloadSize;

			if (records.empty())
				workloadSize = 1;
			else
			{
				workloadSize = records.back().workloadSize*2;

				if (workloadSize > MAX_WORKLOAD_SIZE)
				{
					log << TestLog::Message << "Even workload size " << records.back().workloadSize
											<< " doesn't give high enough frame time for program " << m_measureProgramNdx
											<< ". Can't get sensible result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
			}

			records.push_back(WorkloadRecord(workloadSize));
			prepareWorkload(0, workloadSize);
			m_workloadMeasurementNdx = 0;
		}
		else
		{
			m_highWorkloadSizes[m_measureProgramNdx] = records.back().workloadSize;
			m_measureProgramNdx++;

			if (m_measureProgramNdx >= (int)m_programs.size())
			{
				m_state = STATE_MEASURING;
				m_workloadNdx = -1;
				m_measureProgramNdx = 0;
			}

			prepareProgram(m_measureProgramNdx);
			prepareNextRound();
		}
	}
	else
	{
		m_workloadNdx++;

		if (m_workloadNdx < m_numWorkloads)
		{
			DE_ASSERT(m_numWorkloads > 1);
			const int highWorkload	= m_highWorkloadSizes[m_measureProgramNdx];
			const int workload		= highWorkload > m_numWorkloads ?
										1 + m_workloadNdx*(highWorkload-1)/(m_numWorkloads-1) :
										1 + m_workloadNdx;

			prepareWorkload(m_measureProgramNdx, workload);

			m_workloadMeasurementNdx = 0;

			m_workloadRecords[m_measureProgramNdx].push_back(WorkloadRecord(workload));
		}
		else
		{
			m_measureProgramNdx++;

			if (m_measureProgramNdx < (int)m_programs.size())
			{
				m_workloadNdx = -1;
				m_workloadMeasurementNdx = 0;
				prepareProgram(m_measureProgramNdx);
				prepareNextRound();
			}
			else
				m_state = STATE_REPORTING;
		}
	}
}